

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

bool __thiscall
Indexing::CodeTree::RemovingMatcher<false>::doAssignVar(RemovingMatcher<false> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  long in_RDI;
  Entry *fte;
  uint var;
  
  uVar1 = CodeOp::_arg((CodeOp *)0x3489eb);
  Kernel::FlatTerm::operator[](*(FlatTerm **)(in_RDI + 0x10),*(size_t *)(in_RDI + 8));
  uVar2 = Kernel::FlatTerm::Entry::_tag((Entry *)0x348a12);
  if (uVar2 == 2) {
    uVar3 = Kernel::FlatTerm::Entry::_number((Entry *)0x348a28);
    puVar4 = Lib::DArray<unsigned_int>::operator[]
                       ((DArray<unsigned_int> *)(in_RDI + 0x18),(ulong)uVar1);
    *puVar4 = uVar3;
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  }
  return uVar2 == 2;
}

Assistant:

inline bool CodeTree::RemovingMatcher<checkRange>::doAssignVar()
{
  ASS_EQ(op->_instruction(), ASSIGN_VAR);

  //we are looking for variants and they match only other variables into variables
  unsigned var=op->_arg();
  const FlatTerm::Entry* fte=&(*ft)[tp];
  if(fte->_tag()!=FlatTerm::VAR) {
    return false;
  }
  bindings[var]=fte->_number();
  if constexpr (checkRange) {
    if (!range.insert(fte->_number())) {
      return false;
    }
  }
  tp++;
  return true;
}